

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsKeyPressed(ImGuiKey key,ImGuiInputFlags flags,ImGuiID owner_id)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  ImGuiKeyData *pIVar5;
  ImGuiContext *g;
  float repeat_delay;
  double dVar6;
  float repeat_rate;
  
  pIVar2 = GImGui;
  pIVar5 = GetKeyData(GImGui,key);
  if ((pIVar5->Down == true) && (fVar1 = pIVar5->DownDuration, 0.0 <= fVar1)) {
    bVar3 = fVar1 == 0.0;
    if (((fVar1 != 0.0) || (NAN(fVar1))) && ((flags & 0xfeU) != 0 || (flags & 1U) != 0)) {
      repeat_delay = (pIVar2->IO).KeyRepeatDelay;
      if ((flags & 0xeU) == 8) {
        repeat_delay = repeat_delay * 0.72;
        repeat_rate = (pIVar2->IO).KeyRepeatRate * 0.3;
      }
      else if ((flags & 0xeU) == 4) {
        repeat_delay = repeat_delay * 0.72;
        repeat_rate = (pIVar2->IO).KeyRepeatRate * 0.8;
      }
      else {
        repeat_rate = (pIVar2->IO).KeyRepeatRate;
      }
      if (fVar1 <= repeat_delay) {
        bVar3 = false;
      }
      else {
        iVar4 = GetKeyPressedAmount(key,repeat_delay,repeat_rate);
        bVar3 = 0 < iVar4;
      }
      if (((flags & 0xf0U) != 0) && (bVar3)) {
        dVar6 = (pIVar2->Time - (double)fVar1) + 9.999999747378752e-06;
        if (((flags & 0x20U) != 0) && (dVar6 < pIVar2->LastKeyModsChangeTime)) {
          bVar3 = false;
        }
        if (((flags & 0x40U) != 0) && (dVar6 < pIVar2->LastKeyModsChangeFromNoneTime)) {
          bVar3 = false;
        }
        if (((char)flags < '\0') && (dVar6 < pIVar2->LastKeyboardKeyPressTime)) {
          return false;
        }
      }
    }
    if (bVar3) {
      bVar3 = TestKeyOwner(key,owner_id);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, ImGuiInputFlags flags, ImGuiID owner_id)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = key_data->DownDuration;
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!
    if (flags & (ImGuiInputFlags_RepeatRateMask_ | ImGuiInputFlags_RepeatUntilMask_)) // Setting any _RepeatXXX option enables _Repeat
        flags |= ImGuiInputFlags_Repeat;

    bool pressed = (t == 0.0f);
    if (!pressed && (flags & ImGuiInputFlags_Repeat) != 0)
    {
        float repeat_delay, repeat_rate;
        GetTypematicRepeatRate(flags, &repeat_delay, &repeat_rate);
        pressed = (t > repeat_delay) && GetKeyPressedAmount(key, repeat_delay, repeat_rate) > 0;
        if (pressed && (flags & ImGuiInputFlags_RepeatUntilMask_))
        {
            // Slightly bias 'key_pressed_time' as DownDuration is an accumulation of DeltaTime which we compare to an absolute time value.
            // Ideally we'd replace DownDuration with KeyPressedTime but it would break user's code.
            ImGuiContext& g = *GImGui;
            double key_pressed_time = g.Time - t + 0.00001f;
            if ((flags & ImGuiInputFlags_RepeatUntilKeyModsChange) && (g.LastKeyModsChangeTime > key_pressed_time))
                pressed = false;
            if ((flags & ImGuiInputFlags_RepeatUntilKeyModsChangeFromNone) && (g.LastKeyModsChangeFromNoneTime > key_pressed_time))
                pressed = false;
            if ((flags & ImGuiInputFlags_RepeatUntilOtherKeyPress) && (g.LastKeyboardKeyPressTime > key_pressed_time))
                pressed = false;
        }
    }
    if (!pressed)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}